

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void get_default_volpan(DUMB_IT_SIGDATA *sigdata,IT_CHANNEL *channel)

{
  byte bVar1;
  uint uVar2;
  IT_SAMPLE *pIVar3;
  IT_INSTRUMENT *pIVar4;
  ulong uVar5;
  
  uVar5 = (ulong)channel->sample;
  if (uVar5 != 0) {
    pIVar3 = sigdata->sample;
    channel->volume = pIVar3[channel->sample - 1].default_volume;
    uVar2 = sigdata->flags;
    if ((uVar2 & 0x40) == 0) {
      bVar1 = pIVar3[uVar5 - 1].default_pan;
      if ((char)bVar1 < -0x3f) {
        channel->pan = bVar1 & 0x7f;
      }
      if (((uVar2 & 4) != 0) && (-0x40 < (char)bVar1)) {
        pIVar4 = sigdata->instrument;
        uVar5 = (ulong)channel->instrument;
        if (pIVar4[uVar5 - 1].default_pan < 0x41) {
          channel->pan = pIVar4[uVar5 - 1].default_pan;
        }
        if ((char)pIVar4[uVar5 - 1].filter_cutoff < '\0') {
          channel->filter_cutoff = pIVar4[uVar5 - 1].filter_cutoff & 0x7f;
        }
        if ((char)pIVar4[uVar5 - 1].filter_resonance < '\0') {
          channel->filter_resonance = pIVar4[uVar5 - 1].filter_resonance & 0x7f;
          return;
        }
      }
    }
    else if (-1 < (char)uVar2) {
      channel->truepan = (ushort)pIVar3[uVar5 - 1].default_pan << 6 | 0x20;
      return;
    }
  }
  return;
}

Assistant:

static void get_default_volpan(DUMB_IT_SIGDATA *sigdata, IT_CHANNEL *channel)
{
	if (channel->sample == 0)
		return;

	channel->volume = sigdata->sample[channel->sample-1].default_volume;

	if (sigdata->flags & IT_WAS_AN_XM) {
		if (!(sigdata->flags & IT_WAS_A_MOD))
			channel->truepan = 32 + sigdata->sample[channel->sample-1].default_pan*64;
		return;
	}

	{
		int pan = sigdata->sample[channel->sample-1].default_pan;
		if (pan >= 128 && pan <= 192) {
			channel->pan = pan - 128;
			return;
		}
	}

	if (sigdata->flags & IT_USE_INSTRUMENTS) {
		IT_INSTRUMENT *instrument = &sigdata->instrument[channel->instrument-1];
		if (instrument->default_pan <= 64)
			channel->pan = instrument->default_pan;
		if (instrument->filter_cutoff >= 128)
			channel->filter_cutoff = instrument->filter_cutoff - 128;
		if (instrument->filter_resonance >= 128)
			channel->filter_resonance = instrument->filter_resonance - 128;
	}
}